

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>,_bool>
* __thiscall
phmap::priv::
btree_map_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>_>
::try_emplace<>(pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_*>,_bool>
                *__return_storage_ptr__,
               btree_map_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>_>
               *this,key_type *k)

{
  tuple<> local_29;
  undefined1 local_28 [16];
  key_type *key_ref;
  key_type *k_local;
  btree_map_container<phmap::priv::btree<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_256,_false>_>_>
  *this_local;
  
  local_28._8_8_ = k;
  key_ref = k;
  k_local = (key_type *)this;
  std::forward_as_tuple<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::forward_as_tuple<>();
  btree<phmap::priv::map_params<std::__cxx11::string,long,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>,256,false>>
  ::insert_unique<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<>>
            (__return_storage_ptr__,
             (btree<phmap::priv::map_params<std::__cxx11::string,long,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>,256,false>>
              *)this,k,(piecewise_construct_t *)&std::piecewise_construct,
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
              *)local_28,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(key_type &&k, Args &&... args) {
            // Note: `key_ref` exists to avoid a ClangTidy warning about moving from `k`
            // and then using `k` unsequenced. This is safe because the move is into a
            // forwarding reference and insert_unique guarantees that `key` is never
            // referenced after consuming `args`.
            const key_type& key_ref = k;
            return this->tree_.insert_unique(
                key_ref, std::piecewise_construct, std::forward_as_tuple(std::move(k)),
                std::forward_as_tuple(std::forward<Args>(args)...));
        }